

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld)

{
  Trigger *p;
  Trigger *pAction;
  FKey *pFKey;
  int regOld_local;
  ExprList *pChanges_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if ((pParse->db->flags & 0x40000U) != 0) {
    for (pAction = (Trigger *)sqlite3FkReferences(pTab); pAction != (Trigger *)0x0;
        pAction = (Trigger *)pAction->pWhen) {
      p = fkActionTrigger(pParse,pTab,(FKey *)pAction,pChanges);
      if (p != (Trigger *)0x0) {
        sqlite3CodeRowTriggerDirect(pParse,p,pTab,regOld,2,0);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld                      /* Address of array containing old row */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      Trigger *pAction = fkActionTrigger(pParse, pTab, pFKey, pChanges);
      if( pAction ){
        sqlite3CodeRowTriggerDirect(pParse, pAction, pTab, regOld, OE_Abort, 0);
      }
    }
  }
}